

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::adaptive_huffman_data_model::clear(adaptive_huffman_data_model *this)

{
  vector<unsigned_short>::clear(&this->m_sym_freq);
  vector<unsigned_short>::clear(&this->m_codes);
  vector<unsigned_char>::clear(&this->m_code_sizes);
  this->m_decoder_table_bits = '\0';
  this->m_total_syms = 0;
  this->m_update_cycle = 0;
  this->m_symbols_until_update = 0;
  this->m_total_count = 0;
  if (this->m_pDecode_tables != (decoder_tables *)0x0) {
    crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
    this->m_pDecode_tables = (decoder_tables *)0x0;
  }
  return;
}

Assistant:

void adaptive_huffman_data_model::clear() {
  m_sym_freq.clear();
  m_codes.clear();
  m_code_sizes.clear();

  m_total_syms = 0;
  m_update_cycle = 0;
  m_symbols_until_update = 0;
  m_decoder_table_bits = 0;
  m_total_count = 0;

  if (m_pDecode_tables) {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }
}